

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuadsPacked
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  deUint32 val6;
  deUint32 val5;
  deUint32 val4;
  deUint32 val3;
  deUint32 val2;
  deUint32 val1;
  deUint32 w;
  deUint32 z;
  deUint32 y2;
  deUint32 y1;
  deUint32 x2;
  deUint32 x1;
  int quadNdx;
  deRandom rnd;
  deUint32 max2;
  deUint32 min;
  deUint32 max;
  char *resultData;
  char *_data;
  int quadStride;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  
  _data._4_4_ = 0;
  quadStride = stride;
  if (stride == 0) {
    quadStride = 4;
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    _data._4_4_ = quadStride * 6;
  }
  iVar1 = gls::Array::inputTypeSize(INPUTTYPE_INT_2_10_10_10);
  pcVar4 = (char *)operator_new__((long)(offset + _data._4_4_ * (count + -1) + quadStride * 5 +
                                        componentCount * iVar1));
  rnd.w = 10;
  rnd.z = 4;
  deRandom_init((deRandom *)&x1,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    for (x2 = 0; (int)x2 < count; x2 = x2 + 1) {
      dVar2 = deRandom_getUint32((deRandom *)&x1);
      uVar5 = dVar2 % 0x3f6 + 10;
      dVar2 = deRandom_getUint32((deRandom *)&x1);
      uVar6 = dVar2 % (0x400 - uVar5) + 10;
      dVar2 = deRandom_getUint32((deRandom *)&x1);
      iVar1 = dVar2 % 0x3f6 + 10;
      dVar2 = deRandom_getUint32((deRandom *)&x1);
      iVar7 = dVar2 % (0x400U - iVar1) + 10;
      dVar2 = deRandom_getUint32((deRandom *)&x1);
      iVar8 = dVar2 % 0x3f6 + 10;
      dVar2 = deRandom_getUint32((deRandom *)&x1);
      uVar3 = dVar2 & 3;
      alignmentSafeAssignment<unsigned_int>
                (pcVar4 + (long)(int)(x2 * _data._4_4_) + (long)offset,
                 uVar3 << 0x1e | iVar8 * 0x100000 | iVar1 * 0x400 | uVar5);
      alignmentSafeAssignment<unsigned_int>
                (pcVar4 + (long)(int)(x2 * _data._4_4_ + quadStride) + (long)offset,
                 uVar3 << 0x1e | iVar8 * 0x100000 | iVar1 * 0x400 | uVar6);
      alignmentSafeAssignment<unsigned_int>
                (pcVar4 + (long)(int)(x2 * _data._4_4_ + quadStride * 2) + (long)offset,
                 uVar3 << 0x1e | iVar8 * 0x100000 | iVar7 * 0x400 | uVar5);
      alignmentSafeAssignment<unsigned_int>
                (pcVar4 + (long)(int)(x2 * _data._4_4_ + quadStride * 3) + (long)offset,
                 uVar3 << 0x1e | iVar8 * 0x100000 | iVar7 * 0x400 | uVar5);
      alignmentSafeAssignment<unsigned_int>
                (pcVar4 + (long)(int)(x2 * _data._4_4_ + quadStride * 4) + (long)offset,
                 uVar3 << 0x1e | iVar8 * 0x100000 | iVar1 * 0x400 | uVar6);
      alignmentSafeAssignment<unsigned_int>
                (pcVar4 + (long)(int)(x2 * _data._4_4_ + quadStride * 5) + (long)offset,
                 uVar3 << 0x1e | iVar8 * 0x100000 | iVar7 * 0x400 | uVar6);
    }
  }
  return pcVar4;
}

Assistant:

char* RandomArrayGenerator::createQuadsPacked (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive)
{
	DE_ASSERT(componentCount == 4);
	DE_UNREF(componentCount);
	int quadStride = 0;

	if (stride == 0)
		stride = sizeof(deUint32);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* const _data		= new char[offset + quadStride * (count - 1) + stride * 5 + componentCount * Array::inputTypeSize(Array::INPUTTYPE_INT_2_10_10_10)]; // last element must be fully in the array
	char* const resultData	= _data + offset;

	const deUint32 max		= 1024;
	const deUint32 min		= 10;
	const deUint32 max2		= 4;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			for (int quadNdx = 0; quadNdx < count; quadNdx++)
			{
				deUint32 x1	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 x2	= min + deRandom_getUint32(&rnd) % (max - x1);

				deUint32 y1	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 y2	= min + deRandom_getUint32(&rnd) % (max - y1);

				deUint32 z	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 w	= deRandom_getUint32(&rnd) % max2;

				deUint32 val1 = (w << 30) | (z << 20) | (y1 << 10) | x1;
				deUint32 val2 = (w << 30) | (z << 20) | (y1 << 10) | x2;
				deUint32 val3 = (w << 30) | (z << 20) | (y2 << 10) | x1;

				deUint32 val4 = (w << 30) | (z << 20) | (y2 << 10) | x1;
				deUint32 val5 = (w << 30) | (z << 20) | (y1 << 10) | x2;
				deUint32 val6 = (w << 30) | (z << 20) | (y2 << 10) | x2;

				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 0]), val1);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 1]), val2);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 2]), val3);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 3]), val4);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 4]), val5);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 5]), val6);
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}